

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

size_t __thiscall kj::Path::countParts(Path *this,StringPtr path)

{
  size_t sVar1;
  char *pcVar2;
  char *__begin1;
  
  if ((Path *)(path.content.ptr + (long)((long)&this[-1].parts.disposer + 7)) != this) {
    sVar1 = 1;
    pcVar2 = (char *)0x0;
    do {
      sVar1 = sVar1 + (pcVar2[(long)&this->parts] == '/');
      pcVar2 = pcVar2 + 1;
    } while (path.content.ptr + -1 != pcVar2);
    return sVar1;
  }
  return 1;
}

Assistant:

inline const char* end() const { return content.end() - 1; }